

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  size_type sVar3;
  _Base_ptr p_Var4;
  ostream *poVar5;
  char *pcVar6;
  int *piVar7;
  long lVar8;
  __node_base *p_Var9;
  undefined1 local_259;
  sockaddr_in address;
  termios newTermios;
  termios origTermios;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1b0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_170;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_130;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_f0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_70;
  
  bVar1 = ssl::initialize();
  if (bVar1) {
    if (main::categories_abi_cxx11_ == '\0') {
      iVar2 = __cxa_guard_acquire(&main::categories_abi_cxx11_);
      if (iVar2 != 0) {
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<const_char_(&)[10],_const_char_(&)[58],_true>
                  ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&origTermios,(char (*) [10])"--sponsor",
                   (char (*) [58])"Paid promotion, paid referrals and direct advertisements.");
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<const_char_(&)[12],_const_char_(&)[123],_true>
                  (&local_1b0,(char (*) [12])"--selfpromo",
                   (char (*) [123])
                   "Unpaid or self promotion. Includes sections about merchandise, donations, or information about who they collaborated with."
                  );
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<const_char_(&)[14],_const_char_(&)[70],_true>
                  (&local_170,(char (*) [14])"--interaction",
                   (char (*) [70])
                   "Reminders to like, subscribe or follow them in the middle of content.");
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<const_char_(&)[8],_const_char_(&)[121],_true>
                  (&local_130,(char (*) [8])"--intro",
                   (char (*) [121])
                   "An interval without actual content. Pauses, static frames, repeating animations. Not transitions containing information."
                  );
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<const_char_(&)[8],_const_char_(&)[79],_true>
                  (&local_f0,(char (*) [8])"--outro",
                   (char (*) [79])
                   "Credits or when the YouTube endcards appear. Not conclusions with information.")
        ;
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<const_char_(&)[10],_const_char_(&)[140],_true>
                  (&local_b0,(char (*) [10])"--preview",
                   (char (*) [140])
                   "Quick recap of previous episodes, or a preview of what\'s coming up later in the current video. Edited together clips, not spoken summaries."
                  );
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<const_char_(&)[17],_const_char_(&)[106],_true>
                  (&local_70,(char (*) [17])"--music_offtopic",
                   (char (*) [106])
                   "Only in music videos. Non-music sections of music videos that aren\'t already covered by another category."
                  );
        std::
        _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
        ::_Hashtable<std::pair<std::__cxx11::string_const,std::__cxx11::string>const*>
                  ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                    *)&main::categories_abi_cxx11_,&origTermios,&stack0xffffffffffffffd0,0,
                   &newTermios,&address,&local_259);
        lVar8 = 0x180;
        do {
          std::
          pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)(origTermios.c_cc + lVar8 + -0x11));
          lVar8 = lVar8 + -0x40;
        } while (lVar8 != -0x40);
        __cxa_atexit(std::
                     unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::~unordered_map,&main::categories_abi_cxx11_,&__dso_handle);
        __cxa_guard_release(&main::categories_abi_cxx11_);
      }
    }
    for (lVar8 = 1; lVar8 < argc; lVar8 = lVar8 + 1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&origTermios,argv[lVar8],(allocator<char> *)&newTermios);
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &origTermios,"-v");
      if (bVar1) {
LAB_00108d4b:
        s_verbose = true;
      }
      else {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&origTermios,"--verbose");
        if (bVar1) goto LAB_00108d4b;
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&origTermios,"--all-categories");
        if (bVar1) {
          p_Var9 = &main::categories_abi_cxx11_._M_h._M_before_begin;
          while (p_Var9 = p_Var9->_M_nxt, p_Var9 != (__node_base *)0x0) {
            std::__cxx11::string::substr((ulong)&newTermios,(ulong)(p_Var9 + 1));
            std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::_M_insert_unique<std::__cxx11::string>
                      ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                        *)&s_categories_abi_cxx11_,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &newTermios);
            std::__cxx11::string::~string((string *)&newTermios);
          }
        }
        else {
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&origTermios,"-a");
          if (!bVar1) {
            bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&origTermios,"--adblock");
            if (!bVar1) {
              sVar3 = std::
                      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                      ::count(&main::categories_abi_cxx11_._M_h,(key_type *)&origTermios);
              if (sVar3 == 0) {
                printf("Usage: %s [-a|--adblock] [-v|--verbose] [--all-categories]\n",*argv);
                puts(
                    "You may also specify which categories you want to skip, defaults to just sponsors:"
                    );
                p_Var9 = &main::categories_abi_cxx11_._M_h._M_before_begin;
                while (p_Var9 = p_Var9->_M_nxt, p_Var9 != (__node_base *)0x0) {
                  printf("  %s: %s\n",p_Var9[1]._M_nxt,p_Var9[5]._M_nxt);
                }
                puts("\n--adblock is basically untested and might not work, hence not on by default"
                    );
                exit(0x16);
              }
              std::__cxx11::string::substr((ulong)&newTermios,(ulong)&origTermios);
              std::
              _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              ::_M_insert_unique<std::__cxx11::string>
                        ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                          *)&s_categories_abi_cxx11_,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &newTermios);
              std::__cxx11::string::~string((string *)&newTermios);
              goto LAB_00108d52;
            }
          }
          s_adblock = 1;
        }
      }
LAB_00108d52:
      std::__cxx11::string::~string((string *)&origTermios);
    }
    if (s_categories_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
      printf("  Skipping these categories: ");
      for (p_Var4 = s_categories_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var4 != &s_categories_abi_cxx11_._M_t._M_impl.super__Rb_tree_header;
          p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
        printf("%s ",*(undefined8 *)(p_Var4 + 1));
      }
      putchar(10);
    }
    signal(2,signalHandler);
    signal(0xf,signalHandler);
    signal(3,signalHandler);
    tcgetattr(0,(termios *)&origTermios);
    newTermios.c_iflag = origTermios.c_iflag;
    newTermios.c_oflag = origTermios.c_oflag;
    newTermios.c_ispeed = origTermios.c_ispeed;
    newTermios.c_ospeed = origTermios.c_ospeed;
    newTermios.c_cc[0xf] = origTermios.c_cc[0xf];
    newTermios.c_cc[0x10] = origTermios.c_cc[0x10];
    newTermios.c_cc[0x11] = origTermios.c_cc[0x11];
    newTermios.c_cc[0x12] = origTermios.c_cc[0x12];
    newTermios.c_cc[0x13] = origTermios.c_cc[0x13];
    newTermios.c_cc[0x14] = origTermios.c_cc[0x14];
    newTermios.c_cc[0x15] = origTermios.c_cc[0x15];
    newTermios.c_cc[0x16] = origTermios.c_cc[0x16];
    newTermios.c_line = origTermios.c_line;
    newTermios.c_cc[0] = origTermios.c_cc[0];
    newTermios.c_cc[1] = origTermios.c_cc[1];
    newTermios.c_cc[2] = origTermios.c_cc[2];
    newTermios.c_cc[3] = origTermios.c_cc[3];
    newTermios.c_cc[4] = origTermios.c_cc[4];
    newTermios.c_cc[5] = origTermios.c_cc[5];
    newTermios.c_cc[6] = origTermios.c_cc[6];
    newTermios.c_cc[7] = origTermios.c_cc[7];
    newTermios.c_cc[8] = origTermios.c_cc[8];
    newTermios.c_cc[9] = origTermios.c_cc[9];
    newTermios.c_cc[10] = origTermios.c_cc[10];
    newTermios.c_cc[0xb] = origTermios.c_cc[0xb];
    newTermios.c_cc[0xc] = origTermios.c_cc[0xc];
    newTermios.c_cc[0xd] = origTermios.c_cc[0xd];
    newTermios.c_cc[0xe] = origTermios.c_cc[0xe];
    newTermios._8_8_ = origTermios._8_8_ & 0xfffffff5ffffffff;
    tcsetattr(0,0,(termios *)&newTermios);
    iVar2 = 0;
    while (s_running == '\0') {
      s_currentPosition = -1.0;
      nextSegmentStart = -1.0;
      s_lastPositionFetched = -1.0;
      std::__cxx11::string::assign((char *)&currentVideo_abi_cxx11_);
      std::__cxx11::string::assign(cc::mediaSession_abi_cxx11_);
      std::__cxx11::string::assign(cc::dest_abi_cxx11_);
      if (iVar2 != 0) {
        puts("Disconnected, sleeping and re-connecting");
        sleep(10);
      }
      address.sin_family = 0;
      address.sin_port = 0;
      address.sin_addr.s_addr = 0;
      address.sin_zero[0] = '\0';
      address.sin_zero[1] = '\0';
      address.sin_zero[2] = '\0';
      address.sin_zero[3] = '\0';
      address.sin_zero[4] = '\0';
      address.sin_zero[5] = '\0';
      address.sin_zero[6] = '\0';
      address.sin_zero[7] = '\0';
      iVar2 = mdns::openSocket();
      if (-1 < iVar2) {
        bVar1 = mdns::sendRequest(iVar2);
        if (bVar1) {
          bVar1 = mdns::query(iVar2,&address);
          close(iVar2);
          if (!bVar1) {
            piVar7 = __errno_location();
            if (*piVar7 != 0) {
              perror("Failed to find chromecast");
            }
            iVar2 = 2;
            break;
          }
          address.sin_port = 0x491f;
          poVar5 = std::operator<<((ostream *)&std::cout,"Found chromecast: ");
          pcVar6 = inet_ntoa((in_addr)address.sin_addr.s_addr);
          poVar5 = std::operator<<(poVar5,pcVar6);
          std::endl<char,std::char_traits<char>>(poVar5);
        }
      }
      printf("\x1b[?25l");
      std::__cxx11::string::assign((char *)&s_currentStatus_abi_cxx11_);
      iVar2 = loop(&address);
    }
    printf("\x1b[?25h");
    tcsetattr(0,0,(termios *)&origTermios);
  }
  else {
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

int main(int argc, char *argv[])
{
    if (!ssl::initialize()) {
        return 1;
    }
    static std::unordered_map<std::string, std::string> categories = {
        { "--sponsor", "Paid promotion, paid referrals and direct advertisements." },
        { "--selfpromo", "Unpaid or self promotion. Includes sections about merchandise, donations, or information about who they collaborated with." },
        { "--interaction", "Reminders to like, subscribe or follow them in the middle of content." },
        { "--intro", "An interval without actual content. Pauses, static frames, repeating animations. Not transitions containing information." },
        { "--outro", "Credits or when the YouTube endcards appear. Not conclusions with information." },
        { "--preview", "Quick recap of previous episodes, or a preview of what's coming up later in the current video. Edited together clips, not spoken summaries." },
        { "--music_offtopic", "Only in music videos. Non-music sections of music videos that aren't already covered by another category." },
    };
    for (int i=1; i<argc; i++) {
        const std::string arg = argv[i];
        if (arg == "-v" || arg == "--verbose") {
            s_verbose = true;
        } else if (arg == "--all-categories") {
            for (const std::pair<const std::string, std::string> &category : categories) {
                s_categories.insert(category.first.substr(2));
            }
        } else if (arg == "-a" || arg == "--adblock") {
            s_adblock = true;
        } else if (categories.count(arg)) {
            s_categories.insert(arg.substr(2));
        } else {
            printf("Usage: %s [-a|--adblock] [-v|--verbose] [--all-categories]\n", argv[0]);
            puts("You may also specify which categories you want to skip, defaults to just sponsors:");
            for (const std::pair<const std::string, std::string> &category : categories) {
                printf("  %s: %s\n", category.first.c_str(), category.second.c_str());
            }
            puts("\n--adblock is basically untested and might not work, hence not on by default");
            exit(EINVAL);
        }
    }
    if (!s_categories.empty()) {
        printf("  Skipping these categories: ");
        for (const std::string &category : s_categories) {
            printf("%s ", category.c_str());
        }
        puts("");
    }
    signal(SIGINT, &signalHandler);
    signal(SIGTERM, &signalHandler);
    signal(SIGQUIT, &signalHandler);

    termios origTermios;
    tcgetattr(STDIN_FILENO, &origTermios);

    termios newTermios = origTermios;
    newTermios.c_lflag &= ~(ECHO | ICANON);
    tcsetattr(STDIN_FILENO, TCSANOW, &newTermios);

    int ret = 0;
    while (s_running) {
        s_currentPosition = -1.;
        nextSegmentStart = -1.;
        s_lastPositionFetched = -1;
        currentVideo = "";
        cc::mediaSession = "";
        cc::dest = "";

        if (ret != 0) {
            puts("Disconnected, sleeping and re-connecting");
            sleep(10);
        }
        sockaddr_in address{};


        if (!mdns::findChromecast(&address)) {
            ret = ENOENT;
            break;
        }

        // hide cursor
        printf("\033[?25l");
        s_currentStatus = "Connecting...";
        ret = loop(address);
    }

    printf("\033[?25h"); // re-enable cursor
    tcsetattr(STDIN_FILENO, TCSANOW, &origTermios);

    return ret;
}